

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmStateSnapshot *rootSnp,cmStateSnapshot *snp_)

{
  bool bVar1;
  cmStateSnapshot local_b8;
  allocator<char> local_89;
  string local_88;
  cmStateDirectory local_68;
  undefined1 local_40 [8];
  cmStateSnapshot snp;
  cmStateSnapshot *snp__local;
  cmStateSnapshot *rootSnp_local;
  cmGlobalGenerator *this_local;
  
  local_40 = (undefined1  [8])snp_->State;
  snp.State = (cmState *)(snp_->Position).Tree;
  snp.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(snp_->Position).Position;
  snp.Position.Position = (PositionType)snp_;
  while( true ) {
    bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_40);
    if (!bVar1) {
      return false;
    }
    bVar1 = ::operator==((cmStateSnapshot *)local_40,rootSnp);
    if (bVar1) break;
    cmStateSnapshot::GetDirectory(&local_68,(cmStateSnapshot *)local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"EXCLUDE_FROM_ALL",&local_89);
    bVar1 = cmStateDirectory::GetPropertyAsBool(&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    if (bVar1) {
      return true;
    }
    cmStateSnapshot::GetBuildsystemDirectoryParent(&local_b8,(cmStateSnapshot *)local_40);
    local_40 = (undefined1  [8])local_b8.State;
    snp.State = (cmState *)local_b8.Position.Tree;
    snp.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_b8.Position.Position;
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmStateSnapshot const& rootSnp,
                                   cmStateSnapshot const& snp_) const
{
  cmStateSnapshot snp = snp_;
  while (snp.IsValid()) {
    if (snp == rootSnp) {
      // No directory excludes itself.
      return false;
    }

    if (snp.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
      // This directory is excluded from its parent.
      return true;
    }
    snp = snp.GetBuildsystemDirectoryParent();
  }
  return false;
}